

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O0

Vector * Intersection(Vector *Va,Vector *Vb)

{
  int iVar1;
  ElementType x_00;
  int iVar2;
  Vector *V;
  int local_44;
  Vector *Vc;
  ElementType x;
  int k;
  int j;
  int i;
  int n;
  int m;
  Vector *Vb_local;
  Vector *Va_local;
  
  V = (Vector *)malloc(0x10);
  iVar1 = Vb->VectorLength;
  local_44 = iVar1;
  if (Va->VectorLength < iVar1) {
    local_44 = Va->VectorLength;
  }
  InitVector(V,local_44);
  k = 0;
  while (k < iVar1) {
    x_00 = GetNode(Vb,k);
    iVar2 = Find(Va,x_00);
    if (iVar2 != -1) {
      Insert(V,x_00,0);
      k = k + 1;
    }
  }
  return V;
}

Assistant:

Vector *Intersection(Vector *Va,Vector *Vb)  //向量交集
{  //求Va和Vb中的相同元素，并存入Vc
    int m,n,i,j,k;
    ElementType x;
    Vector *Vc = (Vector *)malloc(sizeof(Vector));
    n = Va->VectorLength;
    m = Vb->VectorLength;
    InitVector(Vc,(m>n)?n:m);  //取较小的向量大小作为向量交集的初始化大小
    i = 0;
    j = 0;
    while(i<m)
    {
        x = GetNode(Vb,i);  //从Vb中取一结点
        k = Find(Va,x);  //在Va中查找等值结点
        if(k != -1)  //若找到等值结点
        {
            Insert(Vc, x, j);
            i++;
        }
    }
    return Vc;
}